

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utlru_cache.hpp
# Opt level: O2

size_t __thiscall
cappuccino::utlru_cache<unsigned_long,std::__cxx11::string,(cappuccino::thread_safe)1>::
erase_range<std::vector<unsigned_long,std::allocator<unsigned_long>>>
          (utlru_cache<unsigned_long,std::__cxx11::string,(cappuccino::thread_safe)1> *this,
          vector<unsigned_long,_std::allocator<unsigned_long>_> *key_range)

{
  pointer puVar1;
  iterator iVar2;
  size_t sVar3;
  unsigned_long *key;
  pointer __k;
  
  std::mutex::lock((mutex *)this);
  puVar1 = (key_range->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  sVar3 = 0;
  for (__k = (key_range->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
             super__Vector_impl_data._M_start; __k != puVar1; __k = __k + 1) {
    iVar2 = std::
            _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
            ::find((_Hashtable<unsigned_long,_std::pair<const_unsigned_long,_unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                    *)(this + 0x50),__k);
    if (iVar2.super__Node_iterator_base<std::pair<const_unsigned_long,_unsigned_long>,_false>._M_cur
        != (__node_type *)0x0) {
      utlru_cache<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(cappuccino::thread_safe)1>
      ::do_erase((utlru_cache<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(cappuccino::thread_safe)1>
                  *)this,*(size_t *)
                          ((long)iVar2.
                                 super__Node_iterator_base<std::pair<const_unsigned_long,_unsigned_long>,_false>
                                 ._M_cur + 0x10));
      sVar3 = sVar3 + 1;
    }
  }
  pthread_mutex_unlock((pthread_mutex_t *)this);
  return sVar3;
}

Assistant:

auto erase_range(const range_type& key_range) -> size_t
    {
        size_t deleted_elements{0};

        std::lock_guard guard{m_lock};

        for (auto& key : key_range)
        {
            auto keyed_position = m_keyed_elements.find(key);
            if (keyed_position != m_keyed_elements.end())
            {
                ++deleted_elements;
                do_erase(keyed_position->second);
            }
        }

        return deleted_elements;
    }